

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O0

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
duckdb::LogicalDelimGet::Deserialize(Deserializer *deserializer)

{
  vector<duckdb::LogicalType,_true> *this;
  Deserializer *in_RDI;
  unique_ptr<duckdb::LogicalDelimGet,_std::default_delete<duckdb::LogicalDelimGet>,_true> result;
  vector<duckdb::LogicalType,_true> chunk_types;
  unsigned_long table_index;
  pointer in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff78;
  undefined1 *table_index_00;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined1 local_60 [8];
  char *in_stack_ffffffffffffffa8;
  field_id_t in_stack_ffffffffffffffb6;
  Deserializer *in_stack_ffffffffffffffb8;
  
  _Var1._M_head_impl = (LogicalOperator *)in_RDI;
  this = (vector<duckdb::LogicalType,_true> *)
         Deserializer::ReadPropertyWithDefault<unsigned_long>
                   (in_RDI,(field_id_t)((ulong)in_RDI >> 0x30),in_stack_ffffffffffffff78);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<duckdb::LogicalType,true>>
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb6,in_stack_ffffffffffffffa8);
  operator_new(0x88);
  table_index_00 = local_60;
  vector<duckdb::LogicalType,_true>::vector
            (this,(vector<duckdb::LogicalType,_true> *)in_stack_ffffffffffffff68);
  LogicalDelimGet((LogicalDelimGet *)in_RDI,(idx_t)table_index_00,this);
  unique_ptr<duckdb::LogicalDelimGet,std::default_delete<duckdb::LogicalDelimGet>,true>::
  unique_ptr<std::default_delete<duckdb::LogicalDelimGet>,void>
            ((unique_ptr<duckdb::LogicalDelimGet,_std::default_delete<duckdb::LogicalDelimGet>,_true>
              *)this,in_stack_ffffffffffffff68);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xad3f6e);
  unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>::
  unique_ptr<duckdb::LogicalDelimGet,std::default_delete<std::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>>>,void>
            ((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              *)this,(unique_ptr<duckdb::LogicalDelimGet,_std::default_delete<duckdb::LogicalDelimGet>_>
                      *)in_stack_ffffffffffffff68);
  unique_ptr<duckdb::LogicalDelimGet,_std::default_delete<duckdb::LogicalDelimGet>,_true>::
  ~unique_ptr((unique_ptr<duckdb::LogicalDelimGet,_std::default_delete<duckdb::LogicalDelimGet>,_true>
               *)0xad3f87);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xad3f91);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         )_Var1._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> LogicalDelimGet::Deserialize(Deserializer &deserializer) {
	auto table_index = deserializer.ReadPropertyWithDefault<idx_t>(200, "table_index");
	auto chunk_types = deserializer.ReadPropertyWithDefault<vector<LogicalType>>(201, "chunk_types");
	auto result = duckdb::unique_ptr<LogicalDelimGet>(new LogicalDelimGet(table_index, std::move(chunk_types)));
	return std::move(result);
}